

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ExpressionBinder::Bind
          (ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,optional_ptr<duckdb::LogicalType,_true> result_type,bool root_expression)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  bool bVar5;
  BaseExpression *pBVar6;
  BoundExpression *pBVar7;
  type expr_00;
  pointer pEVar8;
  ParameterNotResolvedException *this_00;
  undefined7 in_register_00000009;
  pointer *__ptr;
  bool in_R8B;
  __alloc_node_gen_t __alloc_node_gen;
  LogicalType exchanged_type;
  ErrorData error_msg;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_270;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_268;
  optional_ptr<duckdb::LogicalType,_true> local_260;
  undefined1 local_258 [32];
  undefined1 local_238 [16];
  _Alloc_hider local_228;
  char local_218 [16];
  _Alloc_hider local_208;
  char local_1f8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e8 [56];
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  char local_198 [16];
  _Alloc_hider local_188;
  char local_178 [16];
  __buckets_ptr local_168;
  size_type local_160;
  __node_base local_158;
  size_type local_150;
  _Prime_rehash_policy local_148;
  __node_base_ptr local_138;
  undefined1 local_130 [72];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8;
  ErrorData local_b0;
  
  local_260.ptr = (LogicalType *)CONCAT71(in_register_00000009,root_expression);
  Bind((ErrorData *)local_130,(ExpressionBinder *)expr,
       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *)
       result_type.ptr,0,in_R8B);
  if (local_130[0] == true) {
    local_1b0._0_2_ = local_130._0_2_;
    local_1a8._M_p = local_198;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,local_130._8_8_,(pointer)(local_130._8_8_ + local_130._16_8_));
    local_188._M_p = local_178;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_130._40_8_,(pointer)(local_130._40_8_ + local_130._48_8_))
    ;
    local_168 = (__buckets_ptr)0x0;
    local_160 = local_e8._M_bucket_count;
    local_158._M_nxt = (_Hash_node_base *)0x0;
    local_150 = local_e8._M_element_count;
    local_148._M_max_load_factor = local_e8._M_rehash_policy._M_max_load_factor;
    local_148._4_4_ = local_e8._M_rehash_policy._4_4_;
    local_148._M_next_resize = local_e8._M_rehash_policy._M_next_resize;
    local_138 = (__node_base_ptr)0x0;
    local_258._0_8_ =
         (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          *)&local_168;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_168,&(((ErrorData *)local_130)->extra_info)._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)local_258);
    BindCorrelatedColumns
              ((BindResult *)local_238,(ExpressionBinder *)expr,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)result_type.ptr,(ErrorData *)local_1b0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_168);
    if (local_188._M_p != local_178) {
      operator_delete(local_188._M_p);
    }
    if (local_1a8._M_p != local_198) {
      operator_delete(local_1a8._M_p);
    }
    if ((bool)local_238[8] == true) {
      ErrorData::ErrorData(&local_b0,(ErrorData *)(local_238 + 8));
      CombineErrors((ErrorData *)local_130,&local_b0);
      ErrorData::~ErrorData(&local_b0);
      local_258._0_8_ = local_258 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,anon_var_dwarf_4ed193b + 9);
      ErrorData::Throw((ErrorData *)local_130,(string *)local_258);
    }
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)result_type.ptr)->super_BaseExpression;
    pBVar7 = BaseExpression::Cast<duckdb::BoundExpression>(pBVar6);
    _Var1._M_head_impl =
         expr[7].
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(&pBVar7->expr);
    ExtractCorrelatedExpressions((Binder *)_Var1._M_head_impl,expr_00);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_1e8);
    if (local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    if (local_228._M_p != local_218) {
      operator_delete(local_228._M_p);
    }
    if ((Expression *)local_238._0_8_ != (Expression *)0x0) {
      (**(code **)(*(_func_int **)local_238._0_8_ + 8))();
    }
  }
  pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)result_type.ptr)->super_BaseExpression;
  pBVar7 = BaseExpression::Cast<duckdb::BoundExpression>(pBVar6);
  _Var2._M_head_impl =
       (pBVar7->expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  this->_vptr_ExpressionBinder = (_func_int **)_Var2._M_head_impl;
  (pBVar7->expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
  .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  if (*(char *)&expr[1].
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl == '\0') {
    if (*(char *)((long)expr[7].
                        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl[9].
                        super_BaseExpression.alias.field_2._M_local_buf + 0xb) == '\0') {
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this);
      bVar5 = ContainsType(&pEVar8->return_type,SQLNULL);
      if (bVar5) {
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)this);
        ExchangeNullType((LogicalType *)local_238,&pEVar8->return_type);
        _Var1._M_head_impl =
             expr[8].
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        local_270._M_head_impl = (Expression *)this->_vptr_ExpressionBinder;
        this->_vptr_ExpressionBinder = (_func_int **)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_258,(ClientContext *)_Var1._M_head_impl,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_270,(LogicalType *)local_238,false);
        uVar4 = local_258._0_8_;
        local_258._0_8_ = (__hashtable_alloc *)0x0;
        pp_Var3 = this->_vptr_ExpressionBinder;
        this->_vptr_ExpressionBinder = (_func_int **)uVar4;
        if (pp_Var3 != (_func_int **)0x0) {
          (**(code **)(*pp_Var3 + 8))();
          if ((__hashtable_alloc *)local_258._0_8_ != (__hashtable_alloc *)0x0) {
            (**(code **)(*(long *)local_258._0_8_ + 8))();
          }
        }
        local_258._0_8_ =
             (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)0x0;
        if (local_270._M_head_impl != (Expression *)0x0) {
          (*((local_270._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_270._M_head_impl = (Expression *)0x0;
        LogicalType::~LogicalType((LogicalType *)local_238);
      }
    }
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)this);
    if ((pEVar8->return_type).id_ == UNKNOWN) {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    _Var1._M_head_impl =
         expr[8].
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    this->_vptr_ExpressionBinder = (_func_int **)0x0;
    local_268._M_head_impl = _Var2._M_head_impl;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)local_238,(ClientContext *)_Var1._M_head_impl,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_268,(LogicalType *)(expr + 1),false);
    uVar4 = local_238._0_8_;
    local_238._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
    pp_Var3 = this->_vptr_ExpressionBinder;
    this->_vptr_ExpressionBinder = (_func_int **)uVar4;
    if (pp_Var3 != (_func_int **)0x0) {
      (**(code **)(*pp_Var3 + 8))();
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_238._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_238._0_8_ + 8))();
      }
    }
    local_238._0_8_ =
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    if (local_268._M_head_impl != (Expression *)0x0) {
      (*((local_268._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_268._M_head_impl = (Expression *)0x0;
  }
  if ((LogicalType *)CONCAT71(in_register_00000009,root_expression) != (LogicalType *)0x0) {
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)this);
    optional_ptr<duckdb::LogicalType,_true>::CheckValid(&local_260);
    if (local_260.ptr != &pEVar8->return_type) {
      (local_260.ptr)->id_ = (pEVar8->return_type).id_;
      (local_260.ptr)->physical_type_ = (pEVar8->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(local_260.ptr)->type_info_,&(pEVar8->return_type).type_info_);
    }
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&((ErrorData *)local_130)->extra_info);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._40_8_ != &(((ErrorData *)local_130)->final_message).field_2) {
    operator_delete((void *)local_130._40_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._8_8_ != &(((ErrorData *)local_130)->raw_message).field_2) {
    operator_delete((void *)local_130._8_8_);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ExpressionBinder::Bind(unique_ptr<ParsedExpression> &expr, optional_ptr<LogicalType> result_type,
                                              bool root_expression) {
	// bind the main expression
	auto error_msg = Bind(expr, 0, root_expression);
	if (error_msg.HasError()) {
		// Try binding the correlated column. If binding the correlated column
		// has error messages, those should be propagated up. So for the test case
		// having subquery failed to bind:14 the real error message should be something like
		// aggregate with constant input must be bound to a root node.
		auto result = BindCorrelatedColumns(expr, error_msg);
		if (result.HasError()) {
			CombineErrors(error_msg, std::move(result.error));
			error_msg.Throw();
		}
		auto &bound_expr = expr->Cast<BoundExpression>();
		ExtractCorrelatedExpressions(binder, *bound_expr.expr);
	}
	auto &bound_expr = expr->Cast<BoundExpression>();
	unique_ptr<Expression> result = std::move(bound_expr.expr);
	if (target_type.id() != LogicalTypeId::INVALID) {
		// the binder has a specific target type: add a cast to that type
		result = BoundCastExpression::AddCastToType(context, std::move(result), target_type);
	} else {
		if (!binder.can_contain_nulls) {
			// SQL NULL type is only used internally in the binder
			// cast to INTEGER if we encounter it outside of the binder
			if (ContainsNullType(result->return_type)) {
				auto exchanged_type = ExchangeNullType(result->return_type);
				result = BoundCastExpression::AddCastToType(context, std::move(result), exchanged_type);
			}
		}
		if (result->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
	}
	if (result_type) {
		*result_type = result->return_type;
	}
	return result;
}